

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode UA_NodeStore_replace(UA_NodeStore *ns,UA_Node *node)

{
  UA_NodeStoreEntry *__ptr;
  UA_StatusCode UVar1;
  UA_NodeStoreEntry **ppUVar2;
  
  ppUVar2 = findNode(ns,&node->nodeId);
  if (ppUVar2 == (UA_NodeStoreEntry **)0x0) {
    UVar1 = 0x80340000;
  }
  else {
    __ptr = *ppUVar2;
    if (__ptr == (UA_NodeStoreEntry *)node[-1].references) {
      UA_Node_deleteMembersAnyNodeClass(&__ptr->node);
      free(__ptr);
      *ppUVar2 = (UA_NodeStoreEntry *)&node[-1].references;
      UVar1 = 0;
    }
    else {
      UA_Node_deleteMembersAnyNodeClass(node);
      free(&node[-1].references);
      UVar1 = 0x80020000;
    }
  }
  return UVar1;
}

Assistant:

UA_StatusCode
UA_NodeStore_replace(UA_NodeStore *ns, UA_Node *node) {
    UA_NodeStoreEntry **entry = findNode(ns, &node->nodeId);
    if(!entry)
        return UA_STATUSCODE_BADNODEIDUNKNOWN;
    UA_NodeStoreEntry *newEntry = container_of(node, UA_NodeStoreEntry, node);
    if(*entry != newEntry->orig) {
        // the node was replaced since the copy was made
        deleteEntry(newEntry);
        return UA_STATUSCODE_BADINTERNALERROR;
    }
    deleteEntry(*entry);
    *entry = newEntry;
    return UA_STATUSCODE_GOOD;
}